

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_*>::expand
          (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_*>
           *this)

{
  void *pvVar1;
  ulong *in_RDI;
  size_t i;
  Node **newStack;
  void *mem;
  size_t newCapacity;
  ulong local_38;
  ulong local_28;
  
  if (*in_RDI == 0) {
    local_38 = 8;
  }
  else {
    local_38 = *in_RDI << 1;
  }
  pvVar1 = Lib::alloc((size_t)in_RDI);
  if (*in_RDI != 0) {
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      *(undefined8 *)((long)pvVar1 + local_28 * 8) = *(undefined8 *)(in_RDI[1] + local_28 * 8);
    }
    Lib::free((void *)in_RDI[1]);
  }
  in_RDI[1] = (ulong)pvVar1;
  in_RDI[2] = in_RDI[1] + *in_RDI * 8;
  in_RDI[3] = in_RDI[1] + local_38 * 8;
  *in_RDI = local_38;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }